

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CGL::GLScene::Mesh::Mesh(Mesh *this,PolymeshInfo *polyMesh,Matrix4x4 *transform)

{
  bool bVar1;
  Matrix4x4 *this_00;
  iterator x;
  Vector4D *this_01;
  Vector4D *pVVar2;
  reference pvVar3;
  _func_int **pp_Var4;
  long in_RSI;
  SceneObject *in_RDI;
  vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_> texcoords;
  int i;
  vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_> vertices;
  Polygon *p;
  iterator __end2;
  iterator __begin2;
  vector<CGL::Collada::Polygon,_std::allocator<CGL::Collada::Polygon>_> *__range2;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  polygons;
  vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_> *in_stack_00000568;
  vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_> *in_stack_00000570;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_00000578;
  HalfedgeMesh *in_stack_00000580;
  vector<CGL::Collada::Polygon,_std::allocator<CGL::Collada::Polygon>_> *in_stack_fffffffffffffea8;
  HalfedgeMesh *in_stack_fffffffffffffeb0;
  value_type *in_stack_fffffffffffffeb8;
  DiffuseBSDF *this_02;
  Vector3D local_128;
  vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_> *in_stack_fffffffffffffef8;
  vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_> *in_stack_ffffffffffffff00;
  Vector4D local_e8 [2];
  double local_a8;
  double local_a0;
  double local_98;
  undefined8 local_90;
  int local_7c;
  vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_> local_78;
  reference local_60;
  Polygon *local_58;
  
  SceneObject::SceneObject(in_RDI);
  MeshView::MeshView((MeshView *)(in_RDI + 1));
  in_RDI->_vptr_SceneObject = (_func_int **)&PTR_set_draw_styles_00397fb0;
  in_RDI[1]._vptr_SceneObject = (_func_int **)&PTR_collapse_selected_edge_00398058;
  MeshFeature::MeshFeature((MeshFeature *)in_stack_fffffffffffffeb0);
  MeshFeature::MeshFeature((MeshFeature *)in_stack_fffffffffffffeb0);
  MeshFeature::MeshFeature((MeshFeature *)in_stack_fffffffffffffeb0);
  this_02 = (DiffuseBSDF *)(in_RDI + 0x17);
  HalfedgeMesh::HalfedgeMesh(in_stack_fffffffffffffeb0);
  MeshResampler::MeshResampler((MeshResampler *)(in_RDI + 0x26));
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0x12f8af);
  this_00 = (Matrix4x4 *)(in_RSI + 0x90);
  x = std::vector<CGL::Collada::Polygon,_std::allocator<CGL::Collada::Polygon>_>::begin
                (in_stack_fffffffffffffea8);
  local_58 = (Polygon *)
             std::vector<CGL::Collada::Polygon,_std::allocator<CGL::Collada::Polygon>_>::end
                       (in_stack_fffffffffffffea8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<CGL::Collada::Polygon_*,_std::vector<CGL::Collada::Polygon,_std::allocator<CGL::Collada::Polygon>_>_>
                        *)in_stack_fffffffffffffeb0,
                       (__normal_iterator<CGL::Collada::Polygon_*,_std::vector<CGL::Collada::Polygon,_std::allocator<CGL::Collada::Polygon>_>_>
                        *)in_stack_fffffffffffffea8);
    if (!bVar1) break;
    local_60 = __gnu_cxx::
               __normal_iterator<CGL::Collada::Polygon_*,_std::vector<CGL::Collada::Polygon,_std::allocator<CGL::Collada::Polygon>_>_>
               ::operator*((__normal_iterator<CGL::Collada::Polygon_*,_std::vector<CGL::Collada::Polygon,_std::allocator<CGL::Collada::Polygon>_>_>
                            *)&stack0xffffffffffffffb0);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::push_back((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)this_02,in_stack_fffffffffffffeb8);
    __gnu_cxx::
    __normal_iterator<CGL::Collada::Polygon_*,_std::vector<CGL::Collada::Polygon,_std::allocator<CGL::Collada::Polygon>_>_>
    ::operator++((__normal_iterator<CGL::Collada::Polygon_*,_std::vector<CGL::Collada::Polygon,_std::allocator<CGL::Collada::Polygon>_>_>
                  *)&stack0xffffffffffffffb0);
  }
  std::vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::vector
            ((vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_> *)in_stack_ffffffffffffff00,
             (vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_> *)in_stack_fffffffffffffef8);
  local_7c = 0;
  while( true ) {
    this_01 = (Vector4D *)(long)local_7c;
    pVVar2 = (Vector4D *)std::vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::size(&local_78)
    ;
    if (pVVar2 <= this_01) break;
    pvVar3 = std::vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::operator[]
                       (&local_78,(long)local_7c);
    Vector4D::Vector4D(local_e8,pvVar3,1.0);
    Matrix4x4::operator*(this_00,(Vector4D *)x._M_current);
    Vector4D::projectTo3D(this_01);
    pvVar3 = std::vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::operator[]
                       (&local_78,(long)local_7c);
    (pvVar3->field_0).field_0.x = local_a8;
    (pvVar3->field_0).field_0.y = local_a0;
    (pvVar3->field_0).field_0.z = local_98;
    *(undefined8 *)((long)&pvVar3->field_0 + 0x18) = local_90;
    local_7c = local_7c + 1;
  }
  std::vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>::vector
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  HalfedgeMesh::build(in_stack_00000580,in_stack_00000578,in_stack_00000570,in_stack_00000568);
  if (*(long *)(in_RSI + 0xa8) == 0) {
    pp_Var4 = (_func_int **)operator_new(0x50);
    Vector3D::Vector3D(&local_128,0.5,0.5,0.5);
    DiffuseBSDF::DiffuseBSDF(this_02,(Vector3D *)this_01);
    in_RDI[0x27]._vptr_SceneObject = pp_Var4;
  }
  else {
    in_RDI[0x27]._vptr_SceneObject = *(_func_int ***)(*(long *)(in_RSI + 0xa8) + 0x48);
  }
  std::vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>::~vector
            ((vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_> *)this_02);
  std::vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::~vector
            ((vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_> *)this_02);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_02);
  return;
}

Assistant:

Mesh::Mesh(Collada::PolymeshInfo& polyMesh, const Matrix4x4& transform) {

  // Build halfedge mesh from polygon soup
  vector< vector<size_t> > polygons;
  for (const Collada::Polygon& p : polyMesh.polygons) {
    polygons.push_back(p.vertex_indices);
  }
  vector<Vector3D> vertices = polyMesh.vertices; // DELIBERATE COPY.
  for (int i = 0; i < vertices.size(); i++) {
    vertices[i] = (transform * Vector4D(vertices[i], 1)).projectTo3D();
  }

  // Read texture coordinates.
  vector<Vector2D> texcoords = polyMesh.texcoords; // DELIBERATE COPY.

  mesh.build(polygons, vertices, texcoords);
  if (polyMesh.material) {
    bsdf = polyMesh.material->bsdf;
  } else {
    bsdf = new DiffuseBSDF(Vector3D(0.5f,0.5f,0.5f));
  }
}